

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_vector_quantity.cpp
# Opt level: O1

void __thiscall
polyscope::SurfaceVertexTangentVectorQuantity::SurfaceVertexTangentVectorQuantity
          (SurfaceVertexTangentVectorQuantity *this,string *name,
          vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
          *vectors_,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *basisX_,vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *basisY_,SurfaceMesh *mesh_,int nSym_,VectorType vectorType_)

{
  pointer pcVar1;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *pvVar2;
  string local_50;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  pvVar2 = basisX_;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
  SurfaceVectorQuantity::SurfaceVectorQuantity
            (&this->super_SurfaceVectorQuantity,&local_50,mesh_,(MeshElement)pvVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  *(undefined ***)&this->super_SurfaceVectorQuantity =
       &PTR__SurfaceVertexTangentVectorQuantity_005f8590;
  TangentVectorQuantity<polyscope::SurfaceVertexTangentVectorQuantity>::TangentVectorQuantity
            (&this->super_TangentVectorQuantity<polyscope::SurfaceVertexTangentVectorQuantity>,this,
             vectors_,basisX_,basisY_,
             (ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)
             (*(long *)&(this->super_SurfaceVectorQuantity).field_0x190 + 0x458),nSym_,vectorType_);
  *(undefined ***)&this->super_SurfaceVectorQuantity =
       &PTR__SurfaceVertexTangentVectorQuantity_005f8590;
  return;
}

Assistant:

SurfaceVertexTangentVectorQuantity::SurfaceVertexTangentVectorQuantity(
    std::string name, std::vector<glm::vec2> vectors_, std::vector<glm::vec3> basisX_, std::vector<glm::vec3> basisY_,
    SurfaceMesh& mesh_, int nSym_, VectorType vectorType_)
    : SurfaceVectorQuantity(name, mesh_, MeshElement::VERTEX),
      TangentVectorQuantity<SurfaceVertexTangentVectorQuantity>(*this, vectors_, basisX_, basisY_,
                                                                parent.vertexPositions, nSym_, vectorType_) {}